

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O0

base_learner * interact_setup(options_i *options,vw *all)

{
  uchar uVar1;
  byte bVar2;
  long lVar3;
  ostream *poVar4;
  uchar *puVar5;
  pointer piVar6;
  base_learner *base;
  single_learner *predict;
  vw *base_00;
  vw *in_RSI;
  long *in_RDI;
  learner<interact,_example> *l;
  free_ptr<interact> data;
  option_group_definition new_options;
  string s;
  string *in_stack_fffffffffffffd78;
  vw *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  learner<interact,_example> *in_stack_fffffffffffffda0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdc8;
  option_group_definition *in_stack_fffffffffffffdd0;
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [168];
  learner<char,_char> *in_stack_ffffffffffffff40;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [56];
  string local_38 [32];
  vw *local_18;
  long *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::__cxx11::string::string(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Interact via elementwise multiplication",&local_91);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"interact",&local_169);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffffd88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd80);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)(local_168 + 0x20),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_190,"Put weights on feature products from namespaces <n1> and <n2>",&local_191);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffd80);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  (**(code **)*local_10)(local_10,local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"interact",&local_1b9);
  bVar2 = (**(code **)(*local_10 + 8))(local_10,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    lVar3 = std::__cxx11::string::length();
    if (lVar3 == 2) {
      scoped_calloc_or_throw<interact>();
      puVar5 = (uchar *)std::__cxx11::string::operator[]((ulong)local_38);
      uVar1 = *puVar5;
      piVar6 = std::unique_ptr<interact,_void_(*)(void_*)>::operator->
                         ((unique_ptr<interact,_void_(*)(void_*)> *)0x2f10f7);
      piVar6->n1 = uVar1;
      puVar5 = (uchar *)std::__cxx11::string::operator[]((ulong)local_38);
      uVar1 = *puVar5;
      piVar6 = std::unique_ptr<interact,_void_(*)(void_*)>::operator->
                         ((unique_ptr<interact,_void_(*)(void_*)> *)0x2f112e);
      piVar6->n2 = uVar1;
      if ((local_18->quiet & 1U) == 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Interacting namespaces ");
        piVar6 = std::unique_ptr<interact,_void_(*)(void_*)>::operator->
                           ((unique_ptr<interact,_void_(*)(void_*)> *)0x2f1171);
        poVar4 = std::operator<<(poVar4,piVar6->n1);
        poVar4 = std::operator<<(poVar4," and ");
        piVar6 = std::unique_ptr<interact,_void_(*)(void_*)>::operator->
                           ((unique_ptr<interact,_void_(*)(void_*)> *)0x2f11aa);
        in_stack_fffffffffffffda0 = (learner<interact,_example> *)std::operator<<(poVar4,piVar6->n2)
        ;
        std::ostream::operator<<(in_stack_fffffffffffffda0,std::endl<char,std::char_traits<char>>);
      }
      piVar6 = std::unique_ptr<interact,_void_(*)(void_*)>::operator->
                         ((unique_ptr<interact,_void_(*)(void_*)> *)0x2f1214);
      piVar6->all = local_18;
      base = setup_base((options_i *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      predict = LEARNER::as_singleline<char,char>(in_stack_ffffffffffffff40);
      base_00 = (vw *)LEARNER::init_learner<interact,example,LEARNER::learner<char,example>>
                                ((free_ptr<interact> *)in_stack_fffffffffffffda0,
                                 (learner<char,_example> *)base,
                                 (_func_void_interact_ptr_learner<char,_example>_ptr_example_ptr *)
                                 local_18,(_func_void_interact_ptr_learner<char,_example>_ptr_example_ptr
                                           *)predict,(size_t)in_stack_fffffffffffffd80);
      in_stack_fffffffffffffd80 = base_00;
      LEARNER::learner<interact,_example>::set_finish
                (in_stack_fffffffffffffda0,(_func_void_interact_ptr *)base);
      local_8 = LEARNER::make_base<interact,example>((learner<interact,_example> *)base_00);
      std::unique_ptr<interact,_void_(*)(void_*)>::~unique_ptr
                ((unique_ptr<interact,_void_(*)(void_*)> *)local_18);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Need two namespace arguments to interact: ");
      poVar4 = std::operator<<(poVar4,local_38);
      std::operator<<(poVar4," won\'t do EXITING\n");
      local_8 = (base_learner *)0x0;
    }
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd80);
  std::__cxx11::string::~string(local_38);
  return local_8;
}

Assistant:

LEARNER::base_learner* interact_setup(options_i& options, vw& all)
{
  string s;
  option_group_definition new_options("Interact via elementwise multiplication");
  new_options.add(
      make_option("interact", s).keep().help("Put weights on feature products from namespaces <n1> and <n2>"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("interact"))
    return nullptr;

  if (s.length() != 2)
  {
    cerr << "Need two namespace arguments to interact: " << s << " won't do EXITING\n";
    return nullptr;
  }

  auto data = scoped_calloc_or_throw<interact>();

  data->n1 = (unsigned char)s[0];
  data->n2 = (unsigned char)s[1];
  if (!all.quiet)
    cerr << "Interacting namespaces " << data->n1 << " and " << data->n2 << endl;
  data->all = &all;

  LEARNER::learner<interact, example>* l;
  l = &LEARNER::init_learner(
      data, as_singleline(setup_base(options, all)), predict_or_learn<true, true>, predict_or_learn<false, true>, 1);

  l->set_finish(finish);
  return make_base(*l);
}